

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utest.h
# Opt level: O0

int utest_should_filter_test(char *filter,char *testcase)

{
  char *pcVar1;
  bool bVar2;
  char *filter_wildcard;
  char *testcase_cur;
  char *filter_cur;
  char *testcase_local;
  char *filter_local;
  
  filter_wildcard = testcase;
  testcase_cur = filter;
  if (filter == (char *)0x0) {
LAB_0010c325:
    filter_local._4_4_ = 0;
  }
  else {
    do {
      while( true ) {
        pcVar1 = testcase_cur;
        bVar2 = false;
        if (*testcase_cur != '\0') {
          bVar2 = *filter_wildcard != '\0';
        }
        if (!bVar2) {
          if ((*testcase_cur != '\0') ||
             ((*filter_wildcard != '\0' && ((filter == testcase_cur || (testcase_cur[-1] != '*')))))
             ) {
            return 1;
          }
          goto LAB_0010c325;
        }
        if (*testcase_cur == '*') break;
        if (*filter_wildcard != *testcase_cur) {
          return 1;
        }
        filter_wildcard = filter_wildcard + 1;
        testcase_cur = testcase_cur + 1;
      }
      while( true ) {
        testcase_cur = testcase_cur + 1;
        bVar2 = false;
        if (*testcase_cur != '\0') {
          bVar2 = *filter_wildcard != '\0';
        }
        if ((!bVar2) || (*testcase_cur == '*')) break;
        if (*testcase_cur != *filter_wildcard) {
          testcase_cur = pcVar1;
        }
        filter_wildcard = filter_wildcard + 1;
      }
      if ((*testcase_cur == '\0') && (*filter_wildcard == '\0')) {
        return 0;
      }
    } while (*filter_wildcard != '\0');
    filter_local._4_4_ = 1;
  }
  return filter_local._4_4_;
}

Assistant:

UTEST_WEAK int utest_should_filter_test(const char *filter,
                                        const char *testcase) {
  if (filter) {
    const char *filter_cur = filter;
    const char *testcase_cur = testcase;
    const char *filter_wildcard = 0;

    while (('\0' != *filter_cur) && ('\0' != *testcase_cur)) {
      if ('*' == *filter_cur) {
        /* store the position of the wildcard */
        filter_wildcard = filter_cur;

        /* skip the wildcard character */
        filter_cur++;

        while (('\0' != *filter_cur) && ('\0' != *testcase_cur)) {
          if ('*' == *filter_cur) {
            /*
               we found another wildcard (filter is something like *foo*) so we
               exit the current loop, and return to the parent loop to handle
               the wildcard case
            */
            break;
          } else if (*filter_cur != *testcase_cur) {
            /* otherwise our filter didn't match, so reset it */
            filter_cur = filter_wildcard;
          }

          /* move testcase along */
          testcase_cur++;

          /* move filter along */
          filter_cur++;
        }

        if (('\0' == *filter_cur) && ('\0' == *testcase_cur)) {
          return 0;
        }

        /* if the testcase has been exhausted, we don't have a match! */
        if ('\0' == *testcase_cur) {
          return 1;
        }
      } else {
        if (*testcase_cur != *filter_cur) {
          /* test case doesn't match filter */
          return 1;
        } else {
          /* move our filter and testcase forward */
          testcase_cur++;
          filter_cur++;
        }
      }
    }

    if (('\0' != *filter_cur) ||
        (('\0' != *testcase_cur) &&
         ((filter == filter_cur) || ('*' != filter_cur[-1])))) {
      /* we have a mismatch! */
      return 1;
    }
  }

  return 0;
}